

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::ExecuteTests(cmCTest *this)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  cmCTestGenericHandler *pcVar5;
  byte bVar6;
  undefined8 in_RDX;
  undefined1 auVar7 [16];
  string cwd;
  char *local_1b8 [4];
  ostringstream cmCTestLog_msg;
  
  if (this->RunConfigurationScript == true) {
    bVar6 = this->ExtraVerbose;
    if ((bool)bVar6 == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"* Extra verbosity turned on");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x89d,cwd._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&cwd);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      bVar6 = this->ExtraVerbose;
    }
    iVar2 = this->SubmitIndex;
    for (p_Var4 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      lVar1 = *(long *)(p_Var4 + 2);
      *(uint *)(lVar1 + 0x18) = (uint)bVar6;
      *(int *)(lVar1 + 0x90) = iVar2;
    }
    pcVar5 = GetHandler(this,"script");
    pcVar5->HandlerVerbose = (uint)this->Verbose;
    pcVar5 = GetHandler(this,"script");
    iVar2 = (*pcVar5->_vptr_cmCTestGenericHandler[1])(pcVar5);
    if (iVar2 == 0) {
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"running script failing returning: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x8a9,cwd._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&cwd);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  else {
    this->ExtraVerbose = this->Verbose;
    this->Verbose = true;
    iVar2 = this->SubmitIndex;
    p_Var4 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header)
    {
      lVar1 = *(long *)(p_Var4 + 2);
      *(undefined4 *)(lVar1 + 0x18) = 1;
      *(int *)(lVar1 + 0x90) = iVar2;
      auVar7 = std::_Rb_tree_increment(p_Var4);
      in_RDX = auVar7._8_8_;
      p_Var4 = auVar7._0_8_;
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&cwd,(SystemTools *)0x1,SUB81(in_RDX,0));
    iVar2 = Initialize(this,cwd._M_dataplus._M_p,(cmCTestStartCommand *)0x0);
    if (iVar2 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem initializing the dashboard.");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x8bb,local_1b8[0],false);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      iVar2 = 0xc;
    }
    else {
      iVar2 = ProcessSteps(this);
    }
    std::__cxx11::string::~string((string *)&cwd);
    if (iVar2 == 0) {
      return 0;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Running a test(s) failed returning : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x8c3,cwd._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&cwd);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  return iVar2;
}

Assistant:

int cmCTest::ExecuteTests()
{
  int res;
  // call process directory
  if (this->RunConfigurationScript) {
    if (this->ExtraVerbose) {
      cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
    }
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      it->second->SetVerbose(this->ExtraVerbose);
      it->second->SetSubmitIndex(this->SubmitIndex);
    }
    this->GetHandler("script")->SetVerbose(this->Verbose);
    res = this->GetHandler("script")->ProcessHandler();
    if (res != 0) {
      cmCTestLog(this, DEBUG,
                 "running script failing returning: " << res << std::endl);
    }

  } else {
    // What is this?  -V seems to be the same as -VV,
    // and Verbose is always on in this case
    this->ExtraVerbose = this->Verbose;
    this->Verbose = true;
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      it->second->SetVerbose(this->Verbose);
      it->second->SetSubmitIndex(this->SubmitIndex);
    }
    std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
    if (!this->Initialize(cwd.c_str(), CM_NULLPTR)) {
      res = 12;
      cmCTestLog(this, ERROR_MESSAGE, "Problem initializing the dashboard."
                   << std::endl);
    } else {
      res = this->ProcessSteps();
    }
    this->Finalize();
  }
  if (res != 0) {
    cmCTestLog(this, DEBUG,
               "Running a test(s) failed returning : " << res << std::endl);
  }
  return res;
}